

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.cpp
# Opt level: O2

int duckdb::Terminal::HasMoreData(int fd)

{
  uint __i;
  int iVar1;
  long lVar2;
  timeval local_98;
  fd_set rfds;
  
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    rfds.fds_bits[lVar2] = 0;
  }
  rfds.fds_bits[fd / 0x40] = rfds.fds_bits[fd / 0x40] | 1L << ((byte)fd & 0x3f);
  local_98.tv_sec = 0;
  local_98.tv_usec = 0;
  iVar1 = select(1,(fd_set *)&rfds,(fd_set *)0x0,(fd_set *)0x0,&local_98);
  return iVar1;
}

Assistant:

int Terminal::HasMoreData(int fd) {
	fd_set rfds;
	FD_ZERO(&rfds);
	FD_SET(fd, &rfds);

	// no timeout: return immediately
	struct timeval tv;
	tv.tv_sec = 0;
	tv.tv_usec = 0;
	return select(1, &rfds, NULL, NULL, &tv);
}